

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineCommand.cpp
# Opt level: O3

unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> __thiscall
(anonymous_namespace)::runAckermannBuild(int,int,int,std::__cxx11::string_const&,std::__cxx11::
string_const&)::AckermannDelegate::lookupRule(llbuild::core::KeyType_const__
          (void *this,KeyType *keyData)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  long *in_RDX;
  
  paVar1 = &(keyData->key).field_2;
  *(int *)paVar1 = *(int *)paVar1 + 1;
  puVar2 = (undefined8 *)operator_new(0x30);
  *puVar2 = &PTR___cxa_pure_virtual_0020c5b0;
  puVar2[1] = puVar2 + 3;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar2 + 1),*in_RDX,in_RDX[1] + *in_RDX);
  puVar2[5] = 0;
  *puVar2 = &PTR__Rule_0020a360;
  *(undefined8 **)this = puVar2;
  return (__uniq_ptr_data<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>,_true,_true>
         )(__uniq_ptr_data<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>,_true,_true>
           )this;
}

Assistant:

virtual std::unique_ptr<core::Rule> lookupRule(const core::KeyType& keyData) override {
      ++numRules;
      return std::unique_ptr<core::Rule>(new AckermannRule(keyData));
    }